

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

int lj_gc_step_jit(global_State *g,MSize steps)

{
  int iVar1;
  ulong uVar2;
  undefined4 in_ESI;
  long in_RDI;
  bool bVar3;
  int errcode;
  int32_t ostate;
  lua_State *L;
  int in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  
  uVar2 = (ulong)*(uint *)(in_RDI + 0x188);
  uVar4 = *(undefined4 *)(in_RDI + 0x160);
  *(ulong *)(uVar2 + 0x10) = (ulong)*(uint *)((ulong)*(uint *)(uVar2 + 8) + 400);
  *(long *)(uVar2 + 0x18) =
       *(long *)(uVar2 + 0x10) +
       (long)(int)(uint)*(byte *)((ulong)*(uint *)((ulong)*(uint *)(*(long *)(uVar2 + 0x10) + -8) +
                                                  0x10) - 0x39) * 8;
  iVar1 = lj_vm_cpcall(uVar2,0,in_ESI,gc_step_jit_cp);
  *(undefined4 *)(in_RDI + 0x160) = uVar4;
  if (iVar1 != 0) {
    lj_err_throw((lua_State *)CONCAT44(uVar4,iVar1),in_stack_ffffffffffffffdc);
  }
  bVar3 = true;
  if (*(char *)((ulong)*(uint *)(uVar2 + 8) + 0x59) != '\x02') {
    bVar3 = *(char *)((ulong)*(uint *)(uVar2 + 8) + 0x59) == '\x05';
  }
  return (int)bVar3;
}

Assistant:

int LJ_FASTCALL lj_gc_step_jit(global_State *g, MSize steps)
{
  lua_State *L = gco2th(gcref(g->cur_L));
  int32_t ostate = g->vmstate;
  int errcode;
  L->base = tvref(G(L)->jit_base);
  L->top = curr_topL(L);
  errcode = lj_vm_cpcall(L, NULL, (void *)(uintptr_t)steps, gc_step_jit_cp);
  g->vmstate = ostate;
  if (errcode)
    lj_err_throw(L, errcode);  /* Propagate errors. */
  /* Return 1 to force a trace exit. */
  return (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize);
}